

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFunctionDecPOMDPDiscrete.cpp
# Opt level: O1

double __thiscall
ValueFunctionDecPOMDPDiscrete::CalculateV<true>(ValueFunctionDecPOMDPDiscrete *this)

{
  undefined1 auVar1 [16];
  MultiAgentDecisionProcessDiscreteInterface *pMVar2;
  ulong uVar3;
  double dVar4;
  undefined1 auVar5 [64];
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 extraout_var [56];
  
  if (this->_m_nrS != 0) {
    uVar3 = 0;
    dVar6 = 0.0;
    do {
      dVar4 = CalculateVsjohRecursively<true>(this,(Index)uVar3,0,0);
      pMVar2 = (this->_m_pu->super_PlanningUnitMADPDiscrete)._m_madp;
      auVar5._0_8_ = (**(code **)((long)*pMVar2 + 0x48))(pMVar2,uVar3);
      auVar5._8_56_ = extraout_var;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = dVar6;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = dVar4;
      auVar1 = vfmadd231sd_fma(auVar7,auVar5._0_16_,auVar1);
      dVar6 = auVar1._0_8_;
      uVar3 = (ulong)((Index)uVar3 + 1);
    } while (uVar3 < this->_m_nrS);
    return dVar6;
  }
  return 0.0;
}

Assistant:

double ValueFunctionDecPOMDPDiscrete::CalculateV()
{
#if DEBUG_CALCV
    if(DEBUG_CALCV_CACHE)
        std::cout << "CalculateV0Recursively::creating a new value function" << std::endl;
    std::cout << "evaluating joint policy:\n"; GetJPol()->Print();
#endif

    double val = 0;
    for(Index sI = 0; sI < _m_nrS; sI++)
    {
        double v_sI=CalculateVsjohRecursively<CACHED>(sI, Globals::INITIAL_JOHI, 0);
#if DEBUG_CALCV
        std::cout << ">>>ValueFunctionDecPOMDPDiscrete::CalculateV() -"
                  << " CalculateVsjohRecursively(sI=" << sI
                  << ", INITIAL_JOHI, Cached ) = " << v_sI << std::endl;
#endif
        val +=  _m_pu->GetInitialStateProbability(sI) * v_sI;
    }
#if DEBUG_CALCV
    std::cout << "This policy's V=" << val <<std::endl;
#endif
    return val;
}